

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t decimalPosition_00;
  char *decimals_00;
  int iVar8;
  double dVar9;
  double result;
  double local_30;
  
  if (d < 0.0) {
    __assert_fail("d >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe1,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (length == 0) {
    __assert_fail("length >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe2,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  bVar2 = StrtodFast(d,p,&local_30);
  dVar9 = local_30;
  if (!bVar2) {
    lVar6 = -decimalPosition;
    decimals_00 = decimals;
    for (sVar4 = length; (*decimals_00 == '0' && (1 < sVar4)); sVar4 = sVar4 - 1) {
      decimals_00 = decimals_00 + 1;
      lVar6 = lVar6 + 1;
    }
    lVar7 = 0;
    uVar5 = sVar4 & 0xffffffff;
    while( true ) {
      uVar1 = sVar4 + lVar7;
      iVar8 = (int)uVar5;
      if ((uVar1 < 2) || (decimals[lVar7 + (length - 1)] != '0')) break;
      lVar7 = lVar7 + -1;
      uVar5 = (ulong)(iVar8 - 1);
    }
    sVar4 = 0x30c;
    if ((int)uVar1 < 0x30d) {
      sVar4 = uVar1;
    }
    iVar3 = 0x30c;
    if (0x30c < iVar8) {
      iVar3 = iVar8;
    }
    iVar8 = exp + iVar3 + -0x30c;
    dVar9 = 0.0;
    if (-0x145 < (iVar8 + (int)sVar4) - (int)lVar7) {
      iVar8 = iVar8 - (int)lVar7;
      decimalPosition_00 = lVar7 - ((ulong)(iVar3 - 0x30c) + lVar6);
      bVar2 = StrtodDiyFp(decimals_00,sVar4,decimalPosition_00,iVar8,&local_30);
      dVar9 = local_30;
      if (!bVar2) {
        dVar9 = StrtodBigInteger(local_30,decimals_00,sVar4,decimalPosition_00,iVar8);
      }
    }
  }
  return dVar9;
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    RAPIDJSON_ASSERT(d >= 0.0);
    RAPIDJSON_ASSERT(length >= 1);

    double result;
    if (StrtodFast(d, p, &result))
        return result;

    // Trim leading zeros
    while (*decimals == '0' && length > 1) {
        length--;
        decimals++;
        decimalPosition--;
    }

    // Trim trailing zeros
    while (decimals[length - 1] == '0' && length > 1) {
        length--;
        decimalPosition--;
        exp++;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 780;
    if (static_cast<int>(length) > kMaxDecimalDigit) {
        int delta = (static_cast<int>(length) - kMaxDecimalDigit);
        exp += delta;
        decimalPosition -= static_cast<unsigned>(delta);
        length = kMaxDecimalDigit;
    }

    // If too small, underflow to zero
    if (int(length) + exp < -324)
        return 0.0;

    if (StrtodDiyFp(decimals, length, decimalPosition, exp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, length, decimalPosition, exp);
}